

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O2

bool rtc::tokenize_first(string *source,char delimiter,string *token,string *rest)

{
  long lVar1;
  long lVar2;
  undefined7 in_register_00000031;
  long lVar3;
  string local_50 [32];
  
  lVar2 = std::__cxx11::string::find((char)source,CONCAT71(in_register_00000031,delimiter));
  if (lVar2 != -1) {
    lVar3 = lVar2;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while ((source->_M_dataplus)._M_p[lVar1] == delimiter);
    std::__cxx11::string::substr((ulong)local_50,(ulong)source);
    std::__cxx11::string::operator=((string *)token,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::substr((ulong)local_50,(ulong)source);
    std::__cxx11::string::operator=((string *)rest,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return lVar2 != -1;
}

Assistant:

bool tokenize_first(const std::string& source,
                    const char delimiter,
                    std::string* token,
                    std::string* rest) {
  // Find the first delimiter
  size_t left_pos = source.find(delimiter);
  if (left_pos == std::string::npos) {
    return false;
  }

  // Look for additional occurrances of delimiter.
  size_t right_pos = left_pos + 1;
  while (source[right_pos] == delimiter) {
    right_pos++;
  }

  *token = source.substr(0, left_pos);
  *rest = source.substr(right_pos);
  return true;
}